

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::get_peer_info
          (torrent *this,
          vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *v)

{
  _Atomic_word *p_Var1;
  pointer ppVar2;
  pointer ppVar3;
  pointer pppVar4;
  peer_connection *ppVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  pointer this_00;
  pointer pppVar8;
  bool bVar9;
  
  ppVar2 = (v->
           super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (v->
           super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = ppVar2;
  if (ppVar3 != ppVar2) {
    do {
      v1_2::peer_info::~peer_info(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != ppVar3);
    (v->
    super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  pppVar4 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pppVar8 = (this->super_torrent_hot_members).m_connections.
                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 .
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pppVar8 != pppVar4;
      pppVar8 = pppVar8 + 1) {
    ppVar5 = *pppVar8;
    p_Var6 = (ppVar5->super_peer_connection_hot_members).m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    bVar9 = true;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar9 = p_Var6->_M_use_count == 0;
      }
    }
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var6->_M_weak_count;
        iVar7 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar7 = p_Var6->_M_weak_count;
        p_Var6->_M_weak_count = iVar7 + -1;
      }
      if (iVar7 == 1) {
        (*p_Var6->_vptr__Sp_counted_base[3])();
      }
    }
    if (!bVar9) {
      ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::
      emplace_back<>(v);
      (*(ppVar5->super_bandwidth_socket)._vptr_bandwidth_socket[0xd])
                (ppVar5,(v->
                        super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1);
    }
  }
  return;
}

Assistant:

void torrent::get_peer_info(std::vector<peer_info>* v)
	{
		v->clear();
		for (auto const* peer : *this)
		{
			TORRENT_ASSERT(peer->m_in_use == 1337);

			// incoming peers that haven't finished the handshake should
			// not be included in this list
			if (peer->associated_torrent().expired()) continue;

			v->emplace_back();
			peer_info& p = v->back();

			peer->get_peer_info(p);
		}
	}